

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_stbvorbis_init_file
                    (char *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_stbvorbis *pVorbis)

{
  stb_vorbis *psVar1;
  char *in_RCX;
  ma_stbvorbis *in_RDX;
  ma_decoding_backend_config *in_RSI;
  ma_stbvorbis *in_RDI;
  ma_result result;
  stb_vorbis_alloc *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  ma_result local_4;
  
  local_4 = ma_stbvorbis_init_internal(in_RSI,in_RDX);
  if (local_4 == MA_SUCCESS) {
    psVar1 = stb_vorbis_open_filename
                       (in_RCX,(int *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *(stb_vorbis **)(in_RCX + 0xa0) = psVar1;
    if (*(long *)(in_RCX + 0xa0) == 0) {
      local_4 = MA_INVALID_FILE;
    }
    else {
      in_RCX[0xa8] = '\0';
      in_RCX[0xa9] = '\0';
      in_RCX[0xaa] = '\0';
      in_RCX[0xab] = '\0';
      local_4 = ma_stbvorbis_post_init(in_RDI);
      if (local_4 == MA_SUCCESS) {
        local_4 = MA_SUCCESS;
      }
      else {
        stb_vorbis_close((stb_vorbis *)0x24306d);
      }
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_stbvorbis_init_file(const char* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_stbvorbis* pVorbis)
{
    ma_result result;

    result = ma_stbvorbis_init_internal(pConfig, pVorbis);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_VORBIS)
    {
        (void)pAllocationCallbacks; /* Don't know how to make use of this with stb_vorbis. */

        /* We can use stb_vorbis' pull mode for file based streams. */
        pVorbis->stb = stb_vorbis_open_filename(pFilePath, NULL, NULL);
        if (pVorbis->stb == NULL) {
            return MA_INVALID_FILE;
        }

        pVorbis->usingPushMode = MA_FALSE;

        result = ma_stbvorbis_post_init(pVorbis);
        if (result != MA_SUCCESS) {
            stb_vorbis_close(pVorbis->stb);
            return result;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. */
        (void)pFilePath;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}